

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void whitespace_suite::run(void)

{
  test_empty();
  test_spaces();
  test_tabs();
  test_carriage_returns();
  test_newlines();
  test_junk();
  return;
}

Assistant:

void run()
{
    test_empty();
    test_spaces();
    test_tabs();
    test_carriage_returns();
    test_newlines();
    test_junk();
}